

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.cpp
# Opt level: O1

string * rtf_format_abi_cxx11_(string *__return_storage_ptr__,char *fmt,va_list *args)

{
  pointer pcVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  vector<char,_std::allocator<char>_> str;
  va_list newargs;
  allocator_type local_61;
  vector<char,_std::allocator<char>_> local_60;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  local_38 = (*args)[0].reg_save_area;
  local_48._0_4_ = args[0][0].gp_offset;
  local_48._4_4_ = args[0][0].fp_offset;
  pvStack_40 = (*args)[0].overflow_arg_area;
  iVar2 = vsnprintf((char *)0x0,0,fmt,&local_48);
  std::vector<char,_std::allocator<char>_>::vector(&local_60,(long)(iVar2 + 1),&local_61);
  local_48._0_4_ = args[0][0].gp_offset;
  local_48._4_4_ = args[0][0].fp_offset;
  pvStack_40 = (*args)[0].overflow_arg_area;
  local_38 = (*args)[0].reg_save_area;
  vsnprintf(local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start,(long)(iVar2 + 1),fmt,&local_48);
  pcVar1 = local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start == (char *)0x0) {
    pcVar4 = (char *)0x1;
  }
  else {
    sVar3 = strlen(local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    pcVar4 = pcVar1 + sVar3;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar1,pcVar4);
  if (local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

string rtf_format(const char* fmt, va_list& args)
{
    va_list newargs;
    va_copy(newargs, args);
    const int chars_written = vsnprintf(nullptr, 0, fmt, newargs);
    const int len = chars_written + 1;

    vector<char> str(len);

    va_end(newargs);

    va_copy(newargs, args);

    vsnprintf(&str[0], len, fmt, newargs);

    va_end(newargs);

    string formatted(&str[0]);

    return formatted;
}